

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

void Wln_ObjSetSlice(Wln_Ntk_t *p,int iObj,int SliceId)

{
  int iVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  
  iVar1 = Vec_IntEntry(&p->vTypes,iObj);
  if (iVar1 == 0x5b) {
    paVar2 = &p->vFanins[iObj].field_2;
    if (2 < p->vFanins[iObj].nSize) {
      paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
    }
    paVar2->Array[1] = SliceId;
    return;
  }
  __assert_fail("Wln_ObjIsSlice(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                ,0x48,"void Wln_ObjSetSlice(Wln_Ntk_t *, int, int)");
}

Assistant:

void Wln_ObjSetSlice( Wln_Ntk_t * p, int iObj, int SliceId )
{
    assert( Wln_ObjIsSlice(p, iObj) );
    Wln_ObjSetFanin( p, iObj, 1, SliceId );
}